

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

http_header * http_header::create(vm_val_t *lstval)

{
  int iVar1;
  char *pcVar2;
  http_header *len;
  char *h;
  vm_val_t ele;
  int i;
  int cnt;
  http_header **tailp;
  http_header *head;
  vm_val_t *in_stack_ffffffffffffff98;
  vm_val_t *in_stack_ffffffffffffffa8;
  http_header *in_stack_ffffffffffffffb0;
  vm_val_t *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc0;
  int local_20;
  http_header **local_18;
  http_header *local_10 [2];
  
  local_10[0] = (http_header *)0x0;
  local_18 = local_10;
  iVar1 = vm_val_t::ll_length(in_stack_ffffffffffffffa8);
  local_20 = 1;
  while( true ) {
    if (iVar1 < local_20) {
      return local_10[0];
    }
    vm_val_t::ll_index(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff98);
    if (pcVar2 == (char *)0x0) break;
    len = (http_header *)operator_new(0x18);
    pcVar2 = pcVar2 + 2;
    in_stack_ffffffffffffffb0 = (http_header *)vmb_get_len((char *)0x25bf29);
    http_header(in_stack_ffffffffffffffb0,pcVar2,(size_t)len);
    *local_18 = len;
    local_18 = &(*local_18)->nxt;
    local_20 = local_20 + 1;
  }
  err_throw(0);
}

Assistant:

static http_header *create(VMG_ const vm_val_t *lstval)
    {
        /* start with an empty list */
        http_header *head = 0, **tailp = &head;
        
        /* parse the value list */
        int cnt = lstval->ll_length(vmg0_);
        for (int i = 1 ; i <= cnt ; ++i)
        {
            /* get this list element */
            vm_val_t ele;
            lstval->ll_index(vmg_ &ele, i);
            
            /* it has to be a string */
            const char *h = ele.get_as_string(vmg0_);
            if (h == 0)
                err_throw(VMERR_STRING_VAL_REQD);

            /* add a new header */
            *tailp = new http_header(h + VMB_LEN, vmb_get_len(h));
            tailp = &(*tailp)->nxt;
        }

        /* return the list head */
        return head;
    }